

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_tracker_connection.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::http_tracker_connection::~http_tracker_connection(http_tracker_connection *this)

{
  (this->super_tracker_connection).super_timeout_handler._vptr_timeout_handler =
       (_func_int **)&PTR_on_timeout_004c9e60;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_tracker_connection).
              super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  tracker_connection::~tracker_connection(&this->super_tracker_connection);
  return;
}

Assistant:

class TORRENT_EXTRA_EXPORT http_tracker_connection
		: public tracker_connection
	{
	friend class tracker_manager;
	public:

		http_tracker_connection(
			io_context& ios
			, tracker_manager& man
			, tracker_request req
			, std::weak_ptr<request_callback> c);

		void start() override;
		void close() override;

	private:

		std::shared_ptr<http_tracker_connection> shared_from_this()
		{
			return std::static_pointer_cast<http_tracker_connection>(
				tracker_connection::shared_from_this());
		}